

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_ea_a(m68k_info *info,int opcode,uint8_t size)

{
  cs_m68k *op;
  undefined7 in_register_00000011;
  uint size_00;
  
  size_00 = (uint)CONCAT71(in_register_00000011,size);
  op = build_init_op(info,opcode,2,size_00);
  get_ea_mode_op(info,op->operands,info->ir,size_00);
  op->operands[1].address_mode = M68K_AM_REG_DIRECT_ADDR;
  op->operands[1].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_A0;
  return;
}

Assistant:

static void build_ea_a(m68k_info *info, int opcode, uint8_t size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);

	op1->address_mode = M68K_AM_REG_DIRECT_ADDR;
	op1->reg = M68K_REG_A0 + ((info->ir >> 9) & 7);
}